

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# des_enc.c
# Opt level: O0

void DES_encrypt1(uint *data,DES_key_schedule *ks,int enc)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint ret_20;
  uint ret_19;
  uint ret_18;
  uint ret_17;
  uint ret_16;
  uint ret_15;
  uint ret_14;
  uint ret_13;
  uint ret_12;
  uint ret_11;
  uint ret_10;
  uint ret_9;
  uint ret_8;
  uint ret_7;
  uint ret_6;
  uint ret_5;
  uint ret_4;
  uint ret_3;
  uint ret_2;
  uint ret_1;
  uint ret;
  DES_LONG tt;
  DES_LONG *s;
  DES_LONG u;
  DES_LONG t;
  DES_LONG r;
  DES_LONG l;
  DES_LONG tt_1;
  uint ret_35;
  uint ret_34;
  uint ret_33;
  uint ret_32;
  uint ret_31;
  uint ret_30;
  uint ret_29;
  uint ret_28;
  uint ret_27;
  uint ret_26;
  uint ret_25;
  uint ret_24;
  uint local_1c;
  uint ret_23;
  uint ret_22;
  uint ret_21;
  
  uVar3 = (data[1] >> 4 ^ *data) & 0xf0f0f0f;
  uVar1 = uVar3 ^ *data;
  uVar2 = uVar3 << 4 ^ data[1];
  uVar3 = (uVar1 >> 0x10 ^ uVar2) & 0xffff;
  uVar2 = uVar3 ^ uVar2;
  uVar1 = uVar3 << 0x10 ^ uVar1;
  uVar3 = (uVar2 >> 2 ^ uVar1) & 0x33333333;
  uVar1 = uVar3 ^ uVar1;
  uVar2 = uVar3 << 2 ^ uVar2;
  uVar3 = (uVar1 >> 8 ^ uVar2) & 0xff00ff;
  uVar2 = uVar3 ^ uVar2;
  uVar1 = uVar3 << 8 ^ uVar1;
  uVar3 = (uVar2 >> 1 ^ uVar1) & 0x55555555;
  uVar1 = uVar3 ^ uVar1;
  uVar2 = uVar3 << 1 ^ uVar2;
  local_1c = uVar1 >> 0x1d | uVar1 << 3;
  uVar3 = uVar2 >> 0x1d | uVar2 << 3;
  if (enc == 0) {
    uVar2 = local_1c ^ ks->ks[0xf].deslong[0];
    uVar4 = local_1c ^ *(uint *)((long)ks->ks + 0x7c);
    uVar1 = uVar4 >> 4;
    uVar3 = DES_SPtrans[0][uVar2 >> 2 & 0x3f] ^ DES_SPtrans[2][uVar2 >> 10 & 0x3f] ^
            DES_SPtrans[4][uVar2 >> 0x12 & 0x3f] ^ DES_SPtrans[6][uVar2 >> 0x1a] ^
            DES_SPtrans[1][(uVar1 & 0xfc) >> 2] ^ DES_SPtrans[3][(uVar1 & 0xfc00) >> 10] ^
            DES_SPtrans[5][(uVar1 & 0xfc0000) >> 0x12] ^
            DES_SPtrans[7][(uVar1 | uVar4 << 0x1c) >> 0x1a] ^ uVar3;
    uVar2 = uVar3 ^ ks->ks[0xe].deslong[0];
    uVar4 = uVar3 ^ *(uint *)((long)ks->ks + 0x74);
    uVar1 = uVar4 >> 4;
    local_1c = DES_SPtrans[0][uVar2 >> 2 & 0x3f] ^ DES_SPtrans[2][uVar2 >> 10 & 0x3f] ^
               DES_SPtrans[4][uVar2 >> 0x12 & 0x3f] ^ DES_SPtrans[6][uVar2 >> 0x1a] ^
               DES_SPtrans[1][(uVar1 & 0xfc) >> 2] ^ DES_SPtrans[3][(uVar1 & 0xfc00) >> 10] ^
               DES_SPtrans[5][(uVar1 & 0xfc0000) >> 0x12] ^
               DES_SPtrans[7][(uVar1 | uVar4 << 0x1c) >> 0x1a] ^ local_1c;
    uVar2 = local_1c ^ ks->ks[0xd].deslong[0];
    uVar4 = local_1c ^ *(uint *)((long)ks->ks + 0x6c);
    uVar1 = uVar4 >> 4;
    uVar3 = DES_SPtrans[0][uVar2 >> 2 & 0x3f] ^ DES_SPtrans[2][uVar2 >> 10 & 0x3f] ^
            DES_SPtrans[4][uVar2 >> 0x12 & 0x3f] ^ DES_SPtrans[6][uVar2 >> 0x1a] ^
            DES_SPtrans[1][(uVar1 & 0xfc) >> 2] ^ DES_SPtrans[3][(uVar1 & 0xfc00) >> 10] ^
            DES_SPtrans[5][(uVar1 & 0xfc0000) >> 0x12] ^
            DES_SPtrans[7][(uVar1 | uVar4 << 0x1c) >> 0x1a] ^ uVar3;
    uVar2 = uVar3 ^ ks->ks[0xc].deslong[0];
    uVar4 = uVar3 ^ *(uint *)((long)ks->ks + 100);
    uVar1 = uVar4 >> 4;
    local_1c = DES_SPtrans[0][uVar2 >> 2 & 0x3f] ^ DES_SPtrans[2][uVar2 >> 10 & 0x3f] ^
               DES_SPtrans[4][uVar2 >> 0x12 & 0x3f] ^ DES_SPtrans[6][uVar2 >> 0x1a] ^
               DES_SPtrans[1][(uVar1 & 0xfc) >> 2] ^ DES_SPtrans[3][(uVar1 & 0xfc00) >> 10] ^
               DES_SPtrans[5][(uVar1 & 0xfc0000) >> 0x12] ^
               DES_SPtrans[7][(uVar1 | uVar4 << 0x1c) >> 0x1a] ^ local_1c;
    uVar2 = local_1c ^ ks->ks[0xb].deslong[0];
    uVar4 = local_1c ^ *(uint *)((long)ks->ks + 0x5c);
    uVar1 = uVar4 >> 4;
    uVar3 = DES_SPtrans[0][uVar2 >> 2 & 0x3f] ^ DES_SPtrans[2][uVar2 >> 10 & 0x3f] ^
            DES_SPtrans[4][uVar2 >> 0x12 & 0x3f] ^ DES_SPtrans[6][uVar2 >> 0x1a] ^
            DES_SPtrans[1][(uVar1 & 0xfc) >> 2] ^ DES_SPtrans[3][(uVar1 & 0xfc00) >> 10] ^
            DES_SPtrans[5][(uVar1 & 0xfc0000) >> 0x12] ^
            DES_SPtrans[7][(uVar1 | uVar4 << 0x1c) >> 0x1a] ^ uVar3;
    uVar2 = uVar3 ^ ks->ks[10].deslong[0];
    uVar4 = uVar3 ^ *(uint *)((long)ks->ks + 0x54);
    uVar1 = uVar4 >> 4;
    local_1c = DES_SPtrans[0][uVar2 >> 2 & 0x3f] ^ DES_SPtrans[2][uVar2 >> 10 & 0x3f] ^
               DES_SPtrans[4][uVar2 >> 0x12 & 0x3f] ^ DES_SPtrans[6][uVar2 >> 0x1a] ^
               DES_SPtrans[1][(uVar1 & 0xfc) >> 2] ^ DES_SPtrans[3][(uVar1 & 0xfc00) >> 10] ^
               DES_SPtrans[5][(uVar1 & 0xfc0000) >> 0x12] ^
               DES_SPtrans[7][(uVar1 | uVar4 << 0x1c) >> 0x1a] ^ local_1c;
    uVar2 = local_1c ^ ks->ks[9].deslong[0];
    uVar4 = local_1c ^ *(uint *)((long)ks->ks + 0x4c);
    uVar1 = uVar4 >> 4;
    uVar3 = DES_SPtrans[0][uVar2 >> 2 & 0x3f] ^ DES_SPtrans[2][uVar2 >> 10 & 0x3f] ^
            DES_SPtrans[4][uVar2 >> 0x12 & 0x3f] ^ DES_SPtrans[6][uVar2 >> 0x1a] ^
            DES_SPtrans[1][(uVar1 & 0xfc) >> 2] ^ DES_SPtrans[3][(uVar1 & 0xfc00) >> 10] ^
            DES_SPtrans[5][(uVar1 & 0xfc0000) >> 0x12] ^
            DES_SPtrans[7][(uVar1 | uVar4 << 0x1c) >> 0x1a] ^ uVar3;
    uVar2 = uVar3 ^ ks->ks[8].deslong[0];
    uVar4 = uVar3 ^ *(uint *)((long)ks->ks + 0x44);
    uVar1 = uVar4 >> 4;
    local_1c = DES_SPtrans[0][uVar2 >> 2 & 0x3f] ^ DES_SPtrans[2][uVar2 >> 10 & 0x3f] ^
               DES_SPtrans[4][uVar2 >> 0x12 & 0x3f] ^ DES_SPtrans[6][uVar2 >> 0x1a] ^
               DES_SPtrans[1][(uVar1 & 0xfc) >> 2] ^ DES_SPtrans[3][(uVar1 & 0xfc00) >> 10] ^
               DES_SPtrans[5][(uVar1 & 0xfc0000) >> 0x12] ^
               DES_SPtrans[7][(uVar1 | uVar4 << 0x1c) >> 0x1a] ^ local_1c;
    uVar2 = local_1c ^ ks->ks[7].deslong[0];
    uVar4 = local_1c ^ *(uint *)((long)ks->ks + 0x3c);
    uVar1 = uVar4 >> 4;
    uVar3 = DES_SPtrans[0][uVar2 >> 2 & 0x3f] ^ DES_SPtrans[2][uVar2 >> 10 & 0x3f] ^
            DES_SPtrans[4][uVar2 >> 0x12 & 0x3f] ^ DES_SPtrans[6][uVar2 >> 0x1a] ^
            DES_SPtrans[1][(uVar1 & 0xfc) >> 2] ^ DES_SPtrans[3][(uVar1 & 0xfc00) >> 10] ^
            DES_SPtrans[5][(uVar1 & 0xfc0000) >> 0x12] ^
            DES_SPtrans[7][(uVar1 | uVar4 << 0x1c) >> 0x1a] ^ uVar3;
    uVar2 = uVar3 ^ ks->ks[6].deslong[0];
    uVar4 = uVar3 ^ *(uint *)((long)ks->ks + 0x34);
    uVar1 = uVar4 >> 4;
    local_1c = DES_SPtrans[0][uVar2 >> 2 & 0x3f] ^ DES_SPtrans[2][uVar2 >> 10 & 0x3f] ^
               DES_SPtrans[4][uVar2 >> 0x12 & 0x3f] ^ DES_SPtrans[6][uVar2 >> 0x1a] ^
               DES_SPtrans[1][(uVar1 & 0xfc) >> 2] ^ DES_SPtrans[3][(uVar1 & 0xfc00) >> 10] ^
               DES_SPtrans[5][(uVar1 & 0xfc0000) >> 0x12] ^
               DES_SPtrans[7][(uVar1 | uVar4 << 0x1c) >> 0x1a] ^ local_1c;
    uVar2 = local_1c ^ ks->ks[5].deslong[0];
    uVar4 = local_1c ^ *(uint *)((long)ks->ks + 0x2c);
    uVar1 = uVar4 >> 4;
    uVar3 = DES_SPtrans[0][uVar2 >> 2 & 0x3f] ^ DES_SPtrans[2][uVar2 >> 10 & 0x3f] ^
            DES_SPtrans[4][uVar2 >> 0x12 & 0x3f] ^ DES_SPtrans[6][uVar2 >> 0x1a] ^
            DES_SPtrans[1][(uVar1 & 0xfc) >> 2] ^ DES_SPtrans[3][(uVar1 & 0xfc00) >> 10] ^
            DES_SPtrans[5][(uVar1 & 0xfc0000) >> 0x12] ^
            DES_SPtrans[7][(uVar1 | uVar4 << 0x1c) >> 0x1a] ^ uVar3;
    uVar2 = uVar3 ^ ks->ks[4].deslong[0];
    uVar4 = uVar3 ^ *(uint *)((long)ks->ks + 0x24);
    uVar1 = uVar4 >> 4;
    local_1c = DES_SPtrans[0][uVar2 >> 2 & 0x3f] ^ DES_SPtrans[2][uVar2 >> 10 & 0x3f] ^
               DES_SPtrans[4][uVar2 >> 0x12 & 0x3f] ^ DES_SPtrans[6][uVar2 >> 0x1a] ^
               DES_SPtrans[1][(uVar1 & 0xfc) >> 2] ^ DES_SPtrans[3][(uVar1 & 0xfc00) >> 10] ^
               DES_SPtrans[5][(uVar1 & 0xfc0000) >> 0x12] ^
               DES_SPtrans[7][(uVar1 | uVar4 << 0x1c) >> 0x1a] ^ local_1c;
    uVar2 = local_1c ^ ks->ks[3].deslong[0];
    uVar4 = local_1c ^ *(uint *)((long)ks->ks + 0x1c);
    uVar1 = uVar4 >> 4;
    uVar3 = DES_SPtrans[0][uVar2 >> 2 & 0x3f] ^ DES_SPtrans[2][uVar2 >> 10 & 0x3f] ^
            DES_SPtrans[4][uVar2 >> 0x12 & 0x3f] ^ DES_SPtrans[6][uVar2 >> 0x1a] ^
            DES_SPtrans[1][(uVar1 & 0xfc) >> 2] ^ DES_SPtrans[3][(uVar1 & 0xfc00) >> 10] ^
            DES_SPtrans[5][(uVar1 & 0xfc0000) >> 0x12] ^
            DES_SPtrans[7][(uVar1 | uVar4 << 0x1c) >> 0x1a] ^ uVar3;
    uVar2 = uVar3 ^ ks->ks[2].deslong[0];
    uVar4 = uVar3 ^ *(uint *)((long)ks->ks + 0x14);
    uVar1 = uVar4 >> 4;
    local_1c = DES_SPtrans[0][uVar2 >> 2 & 0x3f] ^ DES_SPtrans[2][uVar2 >> 10 & 0x3f] ^
               DES_SPtrans[4][uVar2 >> 0x12 & 0x3f] ^ DES_SPtrans[6][uVar2 >> 0x1a] ^
               DES_SPtrans[1][(uVar1 & 0xfc) >> 2] ^ DES_SPtrans[3][(uVar1 & 0xfc00) >> 10] ^
               DES_SPtrans[5][(uVar1 & 0xfc0000) >> 0x12] ^
               DES_SPtrans[7][(uVar1 | uVar4 << 0x1c) >> 0x1a] ^ local_1c;
    uVar2 = local_1c ^ ks->ks[1].deslong[0];
    uVar4 = local_1c ^ *(uint *)((long)ks->ks + 0xc);
    uVar1 = uVar4 >> 4;
    ret_23 = DES_SPtrans[0][uVar2 >> 2 & 0x3f] ^ DES_SPtrans[2][uVar2 >> 10 & 0x3f] ^
             DES_SPtrans[4][uVar2 >> 0x12 & 0x3f] ^ DES_SPtrans[6][uVar2 >> 0x1a] ^
             DES_SPtrans[1][(uVar1 & 0xfc) >> 2] ^ DES_SPtrans[3][(uVar1 & 0xfc00) >> 10] ^
             DES_SPtrans[5][(uVar1 & 0xfc0000) >> 0x12] ^
             DES_SPtrans[7][(uVar1 | uVar4 << 0x1c) >> 0x1a] ^ uVar3;
    uVar1 = ret_23 ^ ks->ks[0].deslong[0];
    uVar2 = ret_23 ^ ks->ks[0].deslong[1];
    uVar3 = uVar2 >> 4;
    local_1c = DES_SPtrans[0][uVar1 >> 2 & 0x3f] ^ DES_SPtrans[2][uVar1 >> 10 & 0x3f] ^
               DES_SPtrans[4][uVar1 >> 0x12 & 0x3f] ^ DES_SPtrans[6][uVar1 >> 0x1a] ^
               DES_SPtrans[1][(uVar3 & 0xfc) >> 2] ^ DES_SPtrans[3][(uVar3 & 0xfc00) >> 10] ^
               DES_SPtrans[5][(uVar3 & 0xfc0000) >> 0x12] ^
               DES_SPtrans[7][(uVar3 | uVar2 << 0x1c) >> 0x1a] ^ local_1c;
  }
  else {
    uVar2 = local_1c ^ ks->ks[0].deslong[0];
    uVar4 = local_1c ^ ks->ks[0].deslong[1];
    uVar1 = uVar4 >> 4;
    uVar3 = DES_SPtrans[0][uVar2 >> 2 & 0x3f] ^ DES_SPtrans[2][uVar2 >> 10 & 0x3f] ^
            DES_SPtrans[4][uVar2 >> 0x12 & 0x3f] ^ DES_SPtrans[6][uVar2 >> 0x1a] ^
            DES_SPtrans[1][(uVar1 & 0xfc) >> 2] ^ DES_SPtrans[3][(uVar1 & 0xfc00) >> 10] ^
            DES_SPtrans[5][(uVar1 & 0xfc0000) >> 0x12] ^
            DES_SPtrans[7][(uVar1 | uVar4 << 0x1c) >> 0x1a] ^ uVar3;
    uVar2 = uVar3 ^ ks->ks[1].deslong[0];
    uVar4 = uVar3 ^ *(uint *)((long)ks->ks + 0xc);
    uVar1 = uVar4 >> 4;
    local_1c = DES_SPtrans[0][uVar2 >> 2 & 0x3f] ^ DES_SPtrans[2][uVar2 >> 10 & 0x3f] ^
               DES_SPtrans[4][uVar2 >> 0x12 & 0x3f] ^ DES_SPtrans[6][uVar2 >> 0x1a] ^
               DES_SPtrans[1][(uVar1 & 0xfc) >> 2] ^ DES_SPtrans[3][(uVar1 & 0xfc00) >> 10] ^
               DES_SPtrans[5][(uVar1 & 0xfc0000) >> 0x12] ^
               DES_SPtrans[7][(uVar1 | uVar4 << 0x1c) >> 0x1a] ^ local_1c;
    uVar2 = local_1c ^ ks->ks[2].deslong[0];
    uVar4 = local_1c ^ *(uint *)((long)ks->ks + 0x14);
    uVar1 = uVar4 >> 4;
    uVar3 = DES_SPtrans[0][uVar2 >> 2 & 0x3f] ^ DES_SPtrans[2][uVar2 >> 10 & 0x3f] ^
            DES_SPtrans[4][uVar2 >> 0x12 & 0x3f] ^ DES_SPtrans[6][uVar2 >> 0x1a] ^
            DES_SPtrans[1][(uVar1 & 0xfc) >> 2] ^ DES_SPtrans[3][(uVar1 & 0xfc00) >> 10] ^
            DES_SPtrans[5][(uVar1 & 0xfc0000) >> 0x12] ^
            DES_SPtrans[7][(uVar1 | uVar4 << 0x1c) >> 0x1a] ^ uVar3;
    uVar2 = uVar3 ^ ks->ks[3].deslong[0];
    uVar4 = uVar3 ^ *(uint *)((long)ks->ks + 0x1c);
    uVar1 = uVar4 >> 4;
    local_1c = DES_SPtrans[0][uVar2 >> 2 & 0x3f] ^ DES_SPtrans[2][uVar2 >> 10 & 0x3f] ^
               DES_SPtrans[4][uVar2 >> 0x12 & 0x3f] ^ DES_SPtrans[6][uVar2 >> 0x1a] ^
               DES_SPtrans[1][(uVar1 & 0xfc) >> 2] ^ DES_SPtrans[3][(uVar1 & 0xfc00) >> 10] ^
               DES_SPtrans[5][(uVar1 & 0xfc0000) >> 0x12] ^
               DES_SPtrans[7][(uVar1 | uVar4 << 0x1c) >> 0x1a] ^ local_1c;
    uVar2 = local_1c ^ ks->ks[4].deslong[0];
    uVar4 = local_1c ^ *(uint *)((long)ks->ks + 0x24);
    uVar1 = uVar4 >> 4;
    uVar3 = DES_SPtrans[0][uVar2 >> 2 & 0x3f] ^ DES_SPtrans[2][uVar2 >> 10 & 0x3f] ^
            DES_SPtrans[4][uVar2 >> 0x12 & 0x3f] ^ DES_SPtrans[6][uVar2 >> 0x1a] ^
            DES_SPtrans[1][(uVar1 & 0xfc) >> 2] ^ DES_SPtrans[3][(uVar1 & 0xfc00) >> 10] ^
            DES_SPtrans[5][(uVar1 & 0xfc0000) >> 0x12] ^
            DES_SPtrans[7][(uVar1 | uVar4 << 0x1c) >> 0x1a] ^ uVar3;
    uVar2 = uVar3 ^ ks->ks[5].deslong[0];
    uVar4 = uVar3 ^ *(uint *)((long)ks->ks + 0x2c);
    uVar1 = uVar4 >> 4;
    local_1c = DES_SPtrans[0][uVar2 >> 2 & 0x3f] ^ DES_SPtrans[2][uVar2 >> 10 & 0x3f] ^
               DES_SPtrans[4][uVar2 >> 0x12 & 0x3f] ^ DES_SPtrans[6][uVar2 >> 0x1a] ^
               DES_SPtrans[1][(uVar1 & 0xfc) >> 2] ^ DES_SPtrans[3][(uVar1 & 0xfc00) >> 10] ^
               DES_SPtrans[5][(uVar1 & 0xfc0000) >> 0x12] ^
               DES_SPtrans[7][(uVar1 | uVar4 << 0x1c) >> 0x1a] ^ local_1c;
    uVar2 = local_1c ^ ks->ks[6].deslong[0];
    uVar4 = local_1c ^ *(uint *)((long)ks->ks + 0x34);
    uVar1 = uVar4 >> 4;
    uVar3 = DES_SPtrans[0][uVar2 >> 2 & 0x3f] ^ DES_SPtrans[2][uVar2 >> 10 & 0x3f] ^
            DES_SPtrans[4][uVar2 >> 0x12 & 0x3f] ^ DES_SPtrans[6][uVar2 >> 0x1a] ^
            DES_SPtrans[1][(uVar1 & 0xfc) >> 2] ^ DES_SPtrans[3][(uVar1 & 0xfc00) >> 10] ^
            DES_SPtrans[5][(uVar1 & 0xfc0000) >> 0x12] ^
            DES_SPtrans[7][(uVar1 | uVar4 << 0x1c) >> 0x1a] ^ uVar3;
    uVar2 = uVar3 ^ ks->ks[7].deslong[0];
    uVar4 = uVar3 ^ *(uint *)((long)ks->ks + 0x3c);
    uVar1 = uVar4 >> 4;
    local_1c = DES_SPtrans[0][uVar2 >> 2 & 0x3f] ^ DES_SPtrans[2][uVar2 >> 10 & 0x3f] ^
               DES_SPtrans[4][uVar2 >> 0x12 & 0x3f] ^ DES_SPtrans[6][uVar2 >> 0x1a] ^
               DES_SPtrans[1][(uVar1 & 0xfc) >> 2] ^ DES_SPtrans[3][(uVar1 & 0xfc00) >> 10] ^
               DES_SPtrans[5][(uVar1 & 0xfc0000) >> 0x12] ^
               DES_SPtrans[7][(uVar1 | uVar4 << 0x1c) >> 0x1a] ^ local_1c;
    uVar2 = local_1c ^ ks->ks[8].deslong[0];
    uVar4 = local_1c ^ *(uint *)((long)ks->ks + 0x44);
    uVar1 = uVar4 >> 4;
    uVar3 = DES_SPtrans[0][uVar2 >> 2 & 0x3f] ^ DES_SPtrans[2][uVar2 >> 10 & 0x3f] ^
            DES_SPtrans[4][uVar2 >> 0x12 & 0x3f] ^ DES_SPtrans[6][uVar2 >> 0x1a] ^
            DES_SPtrans[1][(uVar1 & 0xfc) >> 2] ^ DES_SPtrans[3][(uVar1 & 0xfc00) >> 10] ^
            DES_SPtrans[5][(uVar1 & 0xfc0000) >> 0x12] ^
            DES_SPtrans[7][(uVar1 | uVar4 << 0x1c) >> 0x1a] ^ uVar3;
    uVar2 = uVar3 ^ ks->ks[9].deslong[0];
    uVar4 = uVar3 ^ *(uint *)((long)ks->ks + 0x4c);
    uVar1 = uVar4 >> 4;
    local_1c = DES_SPtrans[0][uVar2 >> 2 & 0x3f] ^ DES_SPtrans[2][uVar2 >> 10 & 0x3f] ^
               DES_SPtrans[4][uVar2 >> 0x12 & 0x3f] ^ DES_SPtrans[6][uVar2 >> 0x1a] ^
               DES_SPtrans[1][(uVar1 & 0xfc) >> 2] ^ DES_SPtrans[3][(uVar1 & 0xfc00) >> 10] ^
               DES_SPtrans[5][(uVar1 & 0xfc0000) >> 0x12] ^
               DES_SPtrans[7][(uVar1 | uVar4 << 0x1c) >> 0x1a] ^ local_1c;
    uVar2 = local_1c ^ ks->ks[10].deslong[0];
    uVar4 = local_1c ^ *(uint *)((long)ks->ks + 0x54);
    uVar1 = uVar4 >> 4;
    uVar3 = DES_SPtrans[0][uVar2 >> 2 & 0x3f] ^ DES_SPtrans[2][uVar2 >> 10 & 0x3f] ^
            DES_SPtrans[4][uVar2 >> 0x12 & 0x3f] ^ DES_SPtrans[6][uVar2 >> 0x1a] ^
            DES_SPtrans[1][(uVar1 & 0xfc) >> 2] ^ DES_SPtrans[3][(uVar1 & 0xfc00) >> 10] ^
            DES_SPtrans[5][(uVar1 & 0xfc0000) >> 0x12] ^
            DES_SPtrans[7][(uVar1 | uVar4 << 0x1c) >> 0x1a] ^ uVar3;
    uVar2 = uVar3 ^ ks->ks[0xb].deslong[0];
    uVar4 = uVar3 ^ *(uint *)((long)ks->ks + 0x5c);
    uVar1 = uVar4 >> 4;
    local_1c = DES_SPtrans[0][uVar2 >> 2 & 0x3f] ^ DES_SPtrans[2][uVar2 >> 10 & 0x3f] ^
               DES_SPtrans[4][uVar2 >> 0x12 & 0x3f] ^ DES_SPtrans[6][uVar2 >> 0x1a] ^
               DES_SPtrans[1][(uVar1 & 0xfc) >> 2] ^ DES_SPtrans[3][(uVar1 & 0xfc00) >> 10] ^
               DES_SPtrans[5][(uVar1 & 0xfc0000) >> 0x12] ^
               DES_SPtrans[7][(uVar1 | uVar4 << 0x1c) >> 0x1a] ^ local_1c;
    uVar2 = local_1c ^ ks->ks[0xc].deslong[0];
    uVar4 = local_1c ^ *(uint *)((long)ks->ks + 100);
    uVar1 = uVar4 >> 4;
    uVar3 = DES_SPtrans[0][uVar2 >> 2 & 0x3f] ^ DES_SPtrans[2][uVar2 >> 10 & 0x3f] ^
            DES_SPtrans[4][uVar2 >> 0x12 & 0x3f] ^ DES_SPtrans[6][uVar2 >> 0x1a] ^
            DES_SPtrans[1][(uVar1 & 0xfc) >> 2] ^ DES_SPtrans[3][(uVar1 & 0xfc00) >> 10] ^
            DES_SPtrans[5][(uVar1 & 0xfc0000) >> 0x12] ^
            DES_SPtrans[7][(uVar1 | uVar4 << 0x1c) >> 0x1a] ^ uVar3;
    uVar2 = uVar3 ^ ks->ks[0xd].deslong[0];
    uVar4 = uVar3 ^ *(uint *)((long)ks->ks + 0x6c);
    uVar1 = uVar4 >> 4;
    local_1c = DES_SPtrans[0][uVar2 >> 2 & 0x3f] ^ DES_SPtrans[2][uVar2 >> 10 & 0x3f] ^
               DES_SPtrans[4][uVar2 >> 0x12 & 0x3f] ^ DES_SPtrans[6][uVar2 >> 0x1a] ^
               DES_SPtrans[1][(uVar1 & 0xfc) >> 2] ^ DES_SPtrans[3][(uVar1 & 0xfc00) >> 10] ^
               DES_SPtrans[5][(uVar1 & 0xfc0000) >> 0x12] ^
               DES_SPtrans[7][(uVar1 | uVar4 << 0x1c) >> 0x1a] ^ local_1c;
    uVar2 = local_1c ^ ks->ks[0xe].deslong[0];
    uVar4 = local_1c ^ *(uint *)((long)ks->ks + 0x74);
    uVar1 = uVar4 >> 4;
    ret_23 = DES_SPtrans[0][uVar2 >> 2 & 0x3f] ^ DES_SPtrans[2][uVar2 >> 10 & 0x3f] ^
             DES_SPtrans[4][uVar2 >> 0x12 & 0x3f] ^ DES_SPtrans[6][uVar2 >> 0x1a] ^
             DES_SPtrans[1][(uVar1 & 0xfc) >> 2] ^ DES_SPtrans[3][(uVar1 & 0xfc00) >> 10] ^
             DES_SPtrans[5][(uVar1 & 0xfc0000) >> 0x12] ^
             DES_SPtrans[7][(uVar1 | uVar4 << 0x1c) >> 0x1a] ^ uVar3;
    uVar1 = ret_23 ^ ks->ks[0xf].deslong[0];
    uVar2 = ret_23 ^ *(uint *)((long)ks->ks + 0x7c);
    uVar3 = uVar2 >> 4;
    local_1c = DES_SPtrans[0][uVar1 >> 2 & 0x3f] ^ DES_SPtrans[2][uVar1 >> 10 & 0x3f] ^
               DES_SPtrans[4][uVar1 >> 0x12 & 0x3f] ^ DES_SPtrans[6][uVar1 >> 0x1a] ^
               DES_SPtrans[1][(uVar3 & 0xfc) >> 2] ^ DES_SPtrans[3][(uVar3 & 0xfc00) >> 10] ^
               DES_SPtrans[5][(uVar3 & 0xfc0000) >> 0x12] ^
               DES_SPtrans[7][(uVar3 | uVar2 << 0x1c) >> 0x1a] ^ local_1c;
  }
  uVar2 = ret_23 >> 3 | ret_23 << 0x1d;
  uVar1 = local_1c >> 3 | local_1c << 0x1d;
  uVar3 = (uVar1 >> 1 ^ uVar2) & 0x55555555;
  uVar2 = uVar3 ^ uVar2;
  uVar1 = uVar3 << 1 ^ uVar1;
  uVar3 = (uVar2 >> 8 ^ uVar1) & 0xff00ff;
  uVar1 = uVar3 ^ uVar1;
  uVar2 = uVar3 << 8 ^ uVar2;
  uVar3 = (uVar1 >> 2 ^ uVar2) & 0x33333333;
  uVar2 = uVar3 ^ uVar2;
  uVar1 = uVar3 << 2 ^ uVar1;
  uVar3 = (uVar2 >> 0x10 ^ uVar1) & 0xffff;
  uVar1 = uVar3 ^ uVar1;
  uVar2 = uVar3 << 0x10 ^ uVar2;
  uVar3 = (uVar1 >> 4 ^ uVar2) & 0xf0f0f0f;
  *data = uVar3 ^ uVar2;
  data[1] = uVar3 << 4 ^ uVar1;
  return;
}

Assistant:

void DES_encrypt1(DES_LONG *data, DES_key_schedule *ks, int enc)
{
    register DES_LONG l, r, t, u;
    register DES_LONG *s;

    r = data[0];
    l = data[1];

    IP(r, l);
    /*
     * Things have been modified so that the initial rotate is done outside
     * the loop.  This required the DES_SPtrans values in sp.h to be rotated
     * 1 bit to the right. One perl script later and things have a 5% speed
     * up on a sparc2. Thanks to Richard Outerbridge for pointing this out.
     */
    /* clear the top bits on machines with 8byte longs */
    /* shift left by 2 */
    r = ROTATE(r, 29) & 0xffffffffL;
    l = ROTATE(l, 29) & 0xffffffffL;

    s = ks->ks->deslong;
    /*
     * I don't know if it is worth the effort of loop unrolling the inner
     * loop
     */
    if (enc) {
        D_ENCRYPT(l, r, 0);     /* 1 */
        D_ENCRYPT(r, l, 2);     /* 2 */
        D_ENCRYPT(l, r, 4);     /* 3 */
        D_ENCRYPT(r, l, 6);     /* 4 */
        D_ENCRYPT(l, r, 8);     /* 5 */
        D_ENCRYPT(r, l, 10);    /* 6 */
        D_ENCRYPT(l, r, 12);    /* 7 */
        D_ENCRYPT(r, l, 14);    /* 8 */
        D_ENCRYPT(l, r, 16);    /* 9 */
        D_ENCRYPT(r, l, 18);    /* 10 */
        D_ENCRYPT(l, r, 20);    /* 11 */
        D_ENCRYPT(r, l, 22);    /* 12 */
        D_ENCRYPT(l, r, 24);    /* 13 */
        D_ENCRYPT(r, l, 26);    /* 14 */
        D_ENCRYPT(l, r, 28);    /* 15 */
        D_ENCRYPT(r, l, 30);    /* 16 */
    } else {
        D_ENCRYPT(l, r, 30);    /* 16 */
        D_ENCRYPT(r, l, 28);    /* 15 */
        D_ENCRYPT(l, r, 26);    /* 14 */
        D_ENCRYPT(r, l, 24);    /* 13 */
        D_ENCRYPT(l, r, 22);    /* 12 */
        D_ENCRYPT(r, l, 20);    /* 11 */
        D_ENCRYPT(l, r, 18);    /* 10 */
        D_ENCRYPT(r, l, 16);    /* 9 */
        D_ENCRYPT(l, r, 14);    /* 8 */
        D_ENCRYPT(r, l, 12);    /* 7 */
        D_ENCRYPT(l, r, 10);    /* 6 */
        D_ENCRYPT(r, l, 8);     /* 5 */
        D_ENCRYPT(l, r, 6);     /* 4 */
        D_ENCRYPT(r, l, 4);     /* 3 */
        D_ENCRYPT(l, r, 2);     /* 2 */
        D_ENCRYPT(r, l, 0);     /* 1 */
    }

    /* rotate and clear the top bits on machines with 8byte longs */
    l = ROTATE(l, 3) & 0xffffffffL;
    r = ROTATE(r, 3) & 0xffffffffL;

    FP(r, l);
    data[0] = l;
    data[1] = r;
    l = r = t = u = 0;
}